

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall Model::Initialize(Model *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pPVar1;
  pointer pcVar2;
  long lVar3;
  Transcript *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
  *pmVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  SpeciesTracker *pSVar7;
  element_type *peVar8;
  Genome *pGVar9;
  iterator iVar10;
  element_type *peVar11;
  pointer pPVar12;
  Model *pMVar13;
  double rate_constant;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
  promoter_name;
  Polymerase pol_template;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rbs_names;
  Polymerase pol;
  double rate_constant_1;
  undefined1 local_2c9;
  BindPolymerase *local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  Genome *local_2b8;
  element_type *local_2b0;
  Gillespie *local_2a8;
  double *local_2a0;
  element_type *local_298;
  Model *local_290;
  undefined1 local_288 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_268;
  Genome *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _func_int **pp_Stack_220;
  undefined1 *local_218;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_210;
  undefined1 local_208 [32];
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  int iStack_1e0;
  char *local_1d8 [2];
  char local_1c8 [16];
  undefined1 local_1b8;
  undefined1 local_1b0 [8];
  _Rb_tree_node_base local_1a8;
  size_t local_188;
  undefined1 local_180 [24];
  key_type local_168;
  int iStack_148;
  int iStack_144;
  undefined8 uStack_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  int iStack_130;
  _Alloc_hider local_128;
  size_type local_120;
  char local_118 [16];
  bool local_108;
  mapped_type local_100;
  Ptr local_f8;
  Ptr local_e8;
  Ptr local_d8;
  Ptr local_c8;
  Ptr local_b8;
  Ptr local_a8;
  Ptr local_98;
  Ptr local_88;
  Ptr local_78;
  Ptr local_68;
  Ptr local_58;
  Ptr local_48;
  pointer local_38;
  
  if (((this->genomes_).
       super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>.
       _M_impl.super__Vector_impl_data._M_finish ==
       (this->genomes_).
       super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>.
       _M_impl.super__Vector_impl_data._M_start) &&
     ((this->transcripts_).
      super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->transcripts_).
      super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Warning: There are no Genome objects registered with Model. Did you forget to register a Genome?"
               ,0x60);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  local_238 = (Genome *)
              (this->genomes_).
              super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->genomes_).
             super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_290 = this;
  if (local_238 != (Genome *)local_38) {
    local_2a0 = &this->cell_volume_;
    local_2a8 = &this->gillespie_;
    do {
      local_2b8 = (((pointer)local_238)->super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
      this_00 = (((pointer)local_238)->super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      pmVar4 = Genome::bindings_abi_cxx11_(local_2b8);
      peVar8 = (element_type *)(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_2b0 = (element_type *)&(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
      if (peVar8 != local_2b0) {
        do {
          local_298 = peVar8;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                  *)local_288,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                  *)((long)&(peVar8->termination_signal_).slots_._M_t._M_impl + 8));
          pPVar1 = (local_290->polymerases_).
                   super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pPVar12 = (local_290->polymerases_).
                         super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
                         super__Vector_impl_data._M_start; pPVar12 != pPVar1; pPVar12 = pPVar12 + 1)
          {
            local_180._8_8_ = (element_type *)0x0;
            local_180._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_180._0_8_ = &PTR___cxa_pure_virtual_001a7450;
            local_168._M_dataplus._M_p = local_180 + 0x28;
            pcVar2 = (pPVar12->super_MobileElement).name_._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_180 + 0x18),pcVar2,
                       pcVar2 + (pPVar12->super_MobileElement).name_._M_string_length);
            iStack_148 = (pPVar12->super_MobileElement).start_;
            iStack_144 = (pPVar12->super_MobileElement).stop_;
            uStack_140._0_4_ = (pPVar12->super_MobileElement).footprint_;
            uStack_140._4_4_ = *(undefined4 *)&(pPVar12->super_MobileElement).field_0x44;
            uStack_138 = *(undefined4 *)&(pPVar12->super_MobileElement).speed_;
            uStack_134 = *(undefined4 *)((long)&(pPVar12->super_MobileElement).speed_ + 4);
            iStack_130 = (pPVar12->super_MobileElement).reading_frame_;
            local_128._M_p = local_118;
            pcVar2 = (pPVar12->super_MobileElement).gene_bound_._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,pcVar2,
                       pcVar2 + (pPVar12->super_MobileElement).gene_bound_._M_string_length);
            local_108 = (pPVar12->super_MobileElement).polymerasereadthrough_;
            local_180._0_8_ = &PTR__MobileElement_001a7480;
            cVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    ::find(&local_268,(key_type *)(local_180 + 0x18));
            if ((_Rb_tree_header *)cVar5._M_node != &local_268._M_impl.super__Rb_tree_header) {
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                     *)&local_268,(key_type *)(local_180 + 0x18));
              local_2c8 = (BindPolymerase *)*pmVar6;
              local_230._8_8_ = 0;
              pp_Stack_220 = (_func_int **)0x0;
              local_230._M_allocated_capacity = (size_type)&PTR___cxa_pure_virtual_001a7450;
              local_218 = local_208;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_218,local_168._M_dataplus._M_p,
                         local_168._M_dataplus._M_p + local_168._M_string_length);
              uStack_1e8 = uStack_138;
              uStack_1e4 = uStack_134;
              iStack_1e0 = iStack_130;
              local_208._16_4_ = iStack_148;
              local_208._20_4_ = iStack_144;
              local_208._24_8_ = uStack_140;
              local_1d8[0] = local_1c8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_208 + 0x30),local_128._M_p,local_128._M_p + local_120);
              local_1b8 = local_108;
              local_230._M_allocated_capacity = (size_type)&PTR__MobileElement_001a7480;
              local_1b0 = (undefined1  [8])0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<BindPolymerase,std::allocator<BindPolymerase>,double&,double&,std::__cxx11::string_const&,Polymerase&>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b0 + 8),
                         (BindPolymerase **)local_1b0,(allocator<BindPolymerase> *)&local_100,
                         (double *)&local_2c8,local_2a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288,(Polymerase *)&local_230);
              std::__shared_ptr<BindPolymerase,(__gnu_cxx::_Lock_policy)2>::
              _M_enable_shared_from_this_with<BindPolymerase,BindPolymerase>
                        ((__shared_ptr<BindPolymerase,(__gnu_cxx::_Lock_policy)2> *)local_1b0,
                         (BindPolymerase *)local_1b0);
              pSVar7 = SpeciesTracker::Instance();
              local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_1a8._4_4_,local_1a8._M_color);
              local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_1b0;
              if (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              SpeciesTracker::Add(pSVar7,(string *)local_288,&local_48);
              if (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_1a8._4_4_,local_1a8._M_color);
              local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_1b0;
              if (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              SpeciesTracker::Add(pSVar7,(string *)(local_180 + 0x18),&local_58);
              if (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_1a8._4_4_,local_1a8._M_color);
              local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_1b0;
              if (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              Gillespie::LinkReaction(local_2a8,&local_68);
              if (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(local_1a8._4_4_,local_1a8._M_color) !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(local_1a8._4_4_,local_1a8._M_color));
              }
              MobileElement::~MobileElement((MobileElement *)&local_230);
            }
            MobileElement::~MobileElement((MobileElement *)local_180);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          ::~_Rb_tree(&local_268);
          if ((BindRnase *)local_288._0_8_ != (BindRnase *)(local_288 + 0x10)) {
            operator_delete((void *)local_288._0_8_);
          }
          peVar8 = (element_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_298);
        } while (peVar8 != local_2b0);
      }
      pGVar9 = local_2b8;
      if ((local_2b8->transcript_degradation_rate_ext_ != 0.0) ||
         (NAN(local_2b8->transcript_degradation_rate_ext_))) {
        Rnase::Rnase((Rnase *)local_180,local_2b8->rnase_footprint_,local_2b8->rnase_speed_);
        local_288._0_8_ = (BindRnase *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<BindRnase,std::allocator<BindRnase>,double_const&,double&,Rnase&,char_const(&)[17]>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),
                   (BindRnase **)local_288,(allocator<BindRnase> *)&local_230,
                   &pGVar9->transcript_degradation_rate_ext_,local_2a0,(Rnase *)local_180,
                   (char (*) [17])"__rnase_site_ext");
        std::__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2>::
        _M_enable_shared_from_this_with<BindRnase,BindRnase>
                  ((__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2> *)local_288,
                   (BindRnase *)local_288._0_8_);
        pSVar7 = SpeciesTracker::Instance();
        local_230._M_allocated_capacity = (size_type)&pp_Stack_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"__rnase_site_ext","");
        local_78.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_288._0_8_;
        local_78.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
          }
        }
        SpeciesTracker::Add(pSVar7,(string *)&local_230,&local_78);
        if (local_78.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((_func_int ***)local_230._M_allocated_capacity != &pp_Stack_220) {
          operator_delete((void *)local_230._M_allocated_capacity);
        }
        local_88.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_288._0_8_;
        local_88.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
          }
        }
        Gillespie::LinkReaction(local_2a8,&local_88);
        if (local_88.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
        }
        MobileElement::~MobileElement((MobileElement *)local_180);
      }
      pGVar9 = local_2b8;
      if ((local_2b8->transcript_degradation_rate_ != 0.0) ||
         (NAN(local_2b8->transcript_degradation_rate_))) {
        Rnase::Rnase((Rnase *)local_180,local_2b8->rnase_footprint_,local_2b8->rnase_speed_);
        local_288._0_8_ = (BindRnase *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<BindRnase,std::allocator<BindRnase>,double_const&,double&,Rnase&,char_const(&)[13]>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),
                   (BindRnase **)local_288,(allocator<BindRnase> *)&local_230,
                   &pGVar9->transcript_degradation_rate_,local_2a0,(Rnase *)local_180,
                   (char (*) [13])"__rnase_site");
        std::__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2>::
        _M_enable_shared_from_this_with<BindRnase,BindRnase>
                  ((__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2> *)local_288,
                   (BindRnase *)local_288._0_8_);
        pSVar7 = SpeciesTracker::Instance();
        local_230._M_allocated_capacity = (size_type)&pp_Stack_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"__rnase_site","");
        local_98.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_288._0_8_;
        local_98.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
          }
        }
        SpeciesTracker::Add(pSVar7,(string *)&local_230,&local_98);
        if (local_98.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((_func_int ***)local_230._M_allocated_capacity != &pp_Stack_220) {
          operator_delete((void *)local_230._M_allocated_capacity);
        }
        local_a8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_288._0_8_;
        local_a8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
          }
        }
        Gillespie::LinkReaction(local_2a8,&local_a8);
        if (local_a8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
        }
        MobileElement::~MobileElement((MobileElement *)local_180);
      }
      else if ((local_2b8->rnase_bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        peVar8 = (element_type *)
                 (local_2b8->rnase_bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_298 = (element_type *)&(local_2b8->rnase_bindings_)._M_t._M_impl.super__Rb_tree_header
        ;
        if (peVar8 != local_298) {
          do {
            local_230._M_allocated_capacity = (size_type)&pp_Stack_220;
            lVar3 = *(long *)&((_Rb_tree_header *)
                              ((long)&(peVar8->termination_signal_).slots_._M_t._M_impl + 8))->
                              _M_header;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_230,lVar3,
                       (long)&(*(_Base_ptr *)
                                ((long)&(peVar8->termination_signal_).slots_._M_t._M_impl + 0x10))->
                              _M_color + lVar3);
            local_210._M_pi =
                 *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(peVar8->termination_signal_).slots_._M_t._M_impl + 0x28);
            Rnase::Rnase((Rnase *)local_180,local_2b8->rnase_footprint_,local_2b8->rnase_speed_);
            local_288._0_8_ = (BindRnase *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<BindRnase,std::allocator<BindRnase>,double&,double&,Rnase&,std::__cxx11::string_const&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),
                       (BindRnase **)local_288,(allocator<BindRnase> *)local_1b0,
                       (double *)&local_210,local_2a0,(Rnase *)local_180,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_230);
            std::__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2>::
            _M_enable_shared_from_this_with<BindRnase,BindRnase>
                      ((__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2> *)local_288,
                       (BindRnase *)local_288._0_8_);
            pSVar7 = SpeciesTracker::Instance();
            local_b8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_288._0_8_;
            local_b8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
              }
            }
            SpeciesTracker::Add(pSVar7,(string *)&local_230,&local_b8);
            if (local_b8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_b8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_c8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_288._0_8_;
            local_c8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
              }
            }
            Gillespie::LinkReaction(local_2a8,&local_c8);
            if (local_c8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
            }
            MobileElement::~MobileElement((MobileElement *)local_180);
            if ((_func_int ***)local_230._M_allocated_capacity != &pp_Stack_220) {
              operator_delete((void *)local_230._M_allocated_capacity);
            }
            peVar8 = (element_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)peVar8);
          } while (peVar8 != local_298);
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      local_238 = (Genome *)((long)local_238 + 0x10);
    } while (local_238 != (Genome *)local_38);
  }
  local_1a8._M_left = (_Base_ptr)(local_1b0 + 8);
  local_1a8._M_color = _S_red;
  local_1a8._M_parent = (_Base_ptr)0x0;
  local_188 = 0;
  pGVar9 = (Genome *)
           (local_290->transcripts_).
           super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_238 = (Genome *)
              (local_290->transcripts_).
              super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pMVar13 = local_290;
  local_1a8._M_right = local_1a8._M_left;
  if (pGVar9 != local_238) {
    local_2a0 = &local_290->cell_volume_;
    local_2a8 = &local_290->gillespie_;
    do {
      this_01 = (Transcript *)(pGVar9->super_Polymer)._vptr_Polymer;
      local_2b0 = (pGVar9->super_Polymer).super_enable_shared_from_this<Polymer>._M_weak_this.
                  super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (local_2b0 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(local_2b0->super_enable_shared_from_this<Polymer>)._M_weak_this.
                   super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(local_2b0->super_enable_shared_from_this<Polymer>)._M_weak_this.
                        super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(local_2b0->super_enable_shared_from_this<Polymer>)._M_weak_this.
                   super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(local_2b0->super_enable_shared_from_this<Polymer>)._M_weak_this.
                        super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_2b8 = pGVar9;
      pmVar4 = Transcript::bindings_abi_cxx11_(this_01);
      peVar11 = (element_type *)(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      peVar8 = local_298;
      while (local_298 = peVar11,
            local_298 != (element_type *)&(pmVar4->_M_t)._M_impl.super__Rb_tree_header) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                *)local_288,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                *)((long)&(local_298->termination_signal_).slots_._M_t._M_impl + 8));
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b0,(key_type *)local_288);
        if (iVar10._M_node == (_Base_ptr)(local_1b0 + 8)) {
          pPVar1 = (pMVar13->polymerases_).
                   super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pPVar12 = (pMVar13->polymerases_).
                         super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
                         super__Vector_impl_data._M_start; pPVar12 != pPVar1; pPVar12 = pPVar12 + 1)
          {
            local_180._8_8_ = (element_type *)0x0;
            local_180._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_180._0_8_ = &PTR___cxa_pure_virtual_001a7450;
            local_168._M_dataplus._M_p = local_180 + 0x28;
            pcVar2 = (pPVar12->super_MobileElement).name_._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_180 + 0x18),pcVar2,
                       pcVar2 + (pPVar12->super_MobileElement).name_._M_string_length);
            iStack_148 = (pPVar12->super_MobileElement).start_;
            iStack_144 = (pPVar12->super_MobileElement).stop_;
            uStack_140._0_4_ = (pPVar12->super_MobileElement).footprint_;
            uStack_140._4_4_ = *(undefined4 *)&(pPVar12->super_MobileElement).field_0x44;
            uStack_138 = *(undefined4 *)&(pPVar12->super_MobileElement).speed_;
            uStack_134 = *(undefined4 *)((long)&(pPVar12->super_MobileElement).speed_ + 4);
            iStack_130 = (pPVar12->super_MobileElement).reading_frame_;
            local_128._M_p = local_118;
            pcVar2 = (pPVar12->super_MobileElement).gene_bound_._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,pcVar2,
                       pcVar2 + (pPVar12->super_MobileElement).gene_bound_._M_string_length);
            local_108 = (pPVar12->super_MobileElement).polymerasereadthrough_;
            local_180._0_8_ = &PTR__MobileElement_001a7480;
            cVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    ::find(&local_268,(key_type *)(local_180 + 0x18));
            if ((_Rb_tree_header *)cVar5._M_node != &local_268._M_impl.super__Rb_tree_header) {
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                     *)&local_268,(key_type *)(local_180 + 0x18));
              local_100 = *pmVar6;
              local_230._8_8_ = 0;
              pp_Stack_220 = (_func_int **)0x0;
              local_230._M_allocated_capacity = (size_type)&PTR___cxa_pure_virtual_001a7450;
              local_218 = local_208;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_218,local_168._M_dataplus._M_p,
                         local_168._M_dataplus._M_p + local_168._M_string_length);
              uStack_1e8 = uStack_138;
              uStack_1e4 = uStack_134;
              iStack_1e0 = iStack_130;
              local_208._16_4_ = iStack_148;
              local_208._20_4_ = iStack_144;
              local_208._24_8_ = uStack_140;
              local_1d8[0] = local_1c8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_208 + 0x30),local_128._M_p,local_128._M_p + local_120);
              local_1b8 = local_108;
              local_230._M_allocated_capacity = (size_type)&PTR__MobileElement_001a7480;
              local_2c8 = (BindPolymerase *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<BindPolymerase,std::allocator<BindPolymerase>,double&,double&,std::__cxx11::string_const&,Polymerase&>
                        (&local_2c0,&local_2c8,(allocator<BindPolymerase> *)&local_2c9,&local_100,
                         local_2a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288,(Polymerase *)&local_230);
              std::__shared_ptr<BindPolymerase,(__gnu_cxx::_Lock_policy)2>::
              _M_enable_shared_from_this_with<BindPolymerase,BindPolymerase>
                        ((__shared_ptr<BindPolymerase,(__gnu_cxx::_Lock_policy)2> *)&local_2c8,
                         local_2c8);
              pSVar7 = SpeciesTracker::Instance();
              local_d8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_2c8;
              local_d8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   local_2c0._M_pi;
              if (local_2c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_2c0._M_pi)->_M_use_count = (local_2c0._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_2c0._M_pi)->_M_use_count = (local_2c0._M_pi)->_M_use_count + 1;
                }
              }
              SpeciesTracker::Add(pSVar7,(string *)local_288,&local_d8);
              if (local_d8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_d8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_e8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_2c8;
              local_e8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   local_2c0._M_pi;
              if (local_2c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_2c0._M_pi)->_M_use_count = (local_2c0._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_2c0._M_pi)->_M_use_count = (local_2c0._M_pi)->_M_use_count + 1;
                }
              }
              SpeciesTracker::Add(pSVar7,(string *)(local_180 + 0x18),&local_e8);
              if (local_e8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_e8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_f8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_2c8;
              local_f8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   local_2c0._M_pi;
              if (local_2c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_2c0._M_pi)->_M_use_count = (local_2c0._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_2c0._M_pi)->_M_use_count = (local_2c0._M_pi)->_M_use_count + 1;
                }
              }
              Gillespie::LinkReaction(local_2a8,&local_f8);
              if (local_f8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_f8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_2c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c0._M_pi);
              }
              MobileElement::~MobileElement((MobileElement *)&local_230);
            }
            MobileElement::~MobileElement((MobileElement *)local_180);
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288)
          ;
          pMVar13 = local_290;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
        ::~_Rb_tree(&local_268);
        if ((BindRnase *)local_288._0_8_ != (BindRnase *)(local_288 + 0x10)) {
          operator_delete((void *)local_288._0_8_);
        }
        peVar11 = (element_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_298);
        peVar8 = local_298;
      }
      local_298 = peVar8;
      if (local_2b0 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0);
      }
      pGVar9 = (Genome *)
               &(local_2b8->super_Polymer).super_enable_shared_from_this<Polymer>._M_weak_this.
                super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    } while (pGVar9 != local_238);
  }
  pMVar13->initialized_ = true;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b0);
  return;
}

Assistant:

void Model::Initialize() {
  if (genomes_.size() == 0 && transcripts_.size() == 0) {
    std::cerr << "Warning: There are no Genome objects registered with "
                 "Model. Did you forget to register a Genome?"
              << std::endl;
  }
  // Create Bind reactions for each promoter-polymerase pair
  for (Genome::Ptr genome : genomes_) {
    for (auto promoter_name : genome->bindings()) {
      for (auto pol : polymerases_) {
        if (promoter_name.second.count(pol.name()) != 0) {
          double rate_constant = promoter_name.second[pol.name()];
          Polymerase pol_template = Polymerase(pol);
          auto reaction = std::make_shared<BindPolymerase>(
              rate_constant, cell_volume_, promoter_name.first, pol_template);
          auto &tracker = SpeciesTracker::Instance();
          tracker.Add(promoter_name.first, reaction);
          tracker.Add(pol.name(), reaction);
          gillespie_.LinkReaction(reaction);
        }
      }
    }
    // Create reaction for external rnase binding
    if (genome->transcript_degradation_rate_ext() != 0.0) {
      auto rnase_template_ext =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
      auto reaction_ext = std::make_shared<BindRnase>(
          genome->transcript_degradation_rate_ext(), cell_volume_,
          rnase_template_ext, "__rnase_site_ext");
      auto &tracker = SpeciesTracker::Instance();
      tracker.Add("__rnase_site_ext", reaction_ext);
      gillespie_.LinkReaction(reaction_ext);
    }
    
    // Create reaction for internal rnase binding
    if (genome->transcript_degradation_rate() != 0.0) {
      // TODO: user defined Rnase speed
      // auto rnase_template = Rnase(10, 30);
      auto rnase_template =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
      auto reaction = std::make_shared<BindRnase>(
          genome->transcript_degradation_rate(), cell_volume_, rnase_template,
          "__rnase_site");
      auto &tracker = SpeciesTracker::Instance();
      tracker.Add("__rnase_site", reaction);
      gillespie_.LinkReaction(reaction);
    } 
    
    // Alternatively, create bind reactions for individual rnase sites
    else if (genome->rnase_bindings().size() != 0) {
      for (auto rnase_site : genome->rnase_bindings()) {
        auto rnase_template =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
        auto reaction = std::make_shared<BindRnase>(
          rnase_site.second, cell_volume_, rnase_template, rnase_site.first);
        auto &tracker = SpeciesTracker::Instance();
        tracker.Add(rnase_site.first, reaction);
        gillespie_.LinkReaction(reaction);
      }
    }
  }
  
  // Initialize transcripts that have been defined independently of genome
  std::set <std::string> rbs_names;
  for (Transcript::Ptr transcript : transcripts_) {
    for (auto rbs_name : transcript->bindings()) {
      if (rbs_names.find(rbs_name.first) == rbs_names.end()) { // only make reactions for unique RBS sites
        for (auto pol : polymerases_) {
          if (rbs_name.second.count(pol.name()) != 0) {
            double rate_constant = rbs_name.second[pol.name()];
            Polymerase pol_template = Polymerase(pol);
            auto reaction = std::make_shared<BindPolymerase>(
                rate_constant, cell_volume_, rbs_name.first, pol_template);
            auto &tracker = SpeciesTracker::Instance();
            tracker.Add(rbs_name.first, reaction);
            tracker.Add(pol.name(), reaction);
            gillespie_.LinkReaction(reaction);
          }
        }
        rbs_names.insert(rbs_name.first);
      }
    }
  }

  initialized_ = true;
}